

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

error_code __thiscall
anon_unknown.dwarf_113dd::yaml_output::string_value(yaml_output *this,string *s)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  string *psVar3;
  ulong uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  string *local_30;
  
  psVar3 = (string *)operator_new(0x30);
  pcVar1 = (s->_M_dataplus)._M_p;
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar1,pcVar1 + s->_M_string_length)
  ;
  (psVar3->super_value)._vptr_value = (_func_int **)&PTR__string_00117708;
  paVar5 = &(psVar3->v_).field_2;
  (psVar3->v_)._M_dataplus._M_p = (pointer)paVar5;
  if (local_50 == &local_40) {
    paVar5->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    *(undefined8 *)((long)&(psVar3->v_).field_2 + 8) = uStack_38;
  }
  else {
    (psVar3->v_)._M_dataplus._M_p = local_50;
    (psVar3->v_).field_2._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
  }
  (psVar3->v_)._M_string_length = local_48;
  local_48 = 0;
  local_40 = '\0';
  psVar3->force_quoted_ = false;
  local_50 = &local_40;
  local_30 = psVar3;
  std::
  deque<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>::
  emplace_back<pstore::dump::string*>
            ((deque<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>
              *)this,&local_30);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  uVar4 = std::_V2::system_category();
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4;
  return (error_code)(auVar2 << 0x40);
}

Assistant:

std::error_code yaml_output::string_value (std::string const & s) {
        out_.emplace (new pstore::dump::string (s));
        return {};
    }